

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

double __thiscall llvm::StringError::log(StringError *this,double __x)

{
  error_category *peVar1;
  size_t in_RCX;
  raw_ostream *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->PrintMsgOnly == true) {
    raw_ostream::write(in_RSI,(int)(this->Msg)._M_dataplus._M_p,(void *)(this->Msg)._M_string_length
                       ,in_RCX);
    return extraout_XMM0_Qa;
  }
  peVar1 = (this->EC)._M_cat;
  (**(code **)(*(long *)peVar1 + 0x20))(&local_48,peVar1,(this->EC)._M_value);
  raw_ostream::write(in_RSI,(int)local_48._M_dataplus._M_p,(void *)local_48._M_string_length,in_RCX)
  ;
  dVar2 = extraout_XMM0_Qa_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    dVar2 = extraout_XMM0_Qa_01;
  }
  if ((this->Msg)._M_string_length != 0) {
    std::operator+(&local_48," ",&this->Msg);
    raw_ostream::write(in_RSI,(int)local_48._M_dataplus._M_p,(void *)local_48._M_string_length,
                       in_RCX);
    dVar2 = extraout_XMM0_Qa_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      dVar2 = extraout_XMM0_Qa_03;
    }
  }
  return dVar2;
}

Assistant:

void StringError::log(raw_ostream &OS) const {
  if (PrintMsgOnly) {
    OS << Msg;
  } else {
    OS << EC.message();
    if (!Msg.empty())
      OS << (" " + Msg);
  }
}